

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O1

void mean_double_4_suite::test_linear_increase_from_offset(void)

{
  value_type *pvVar1;
  moment<double,_4> filter;
  value_type local_80 [2];
  basic_moment<double,_4UL,_(trial::online::with)1> local_70;
  
  local_70.member.window.super_span<double,_4UL>.member.size = 0;
  local_70.member.window.super_span<double,_4UL>.member.next = 4;
  local_70.member.mean = 0.0;
  local_70.member.window.super_span<double,_4UL>.member.data = (pointer)&local_70;
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push(&local_70,10.0);
  local_80[0] = local_70.member.mean;
  pvVar1 = local_80 + 1;
  local_80[1] = 10.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","10.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x107,"void mean_double_4_suite::test_linear_increase_from_offset()",local_80,pvVar1);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push(&local_70,11.0);
  local_80[0] = local_70.member.mean;
  local_80[1] = 10.5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","10.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x109,"void mean_double_4_suite::test_linear_increase_from_offset()",local_80,pvVar1);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push(&local_70,12.0);
  local_80[0] = local_70.member.mean;
  local_80[1] = 11.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","11.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x10b,"void mean_double_4_suite::test_linear_increase_from_offset()",local_80,pvVar1);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push(&local_70,13.0);
  local_80[0] = local_70.member.mean;
  local_80[1] = 11.5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","11.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x10d,"void mean_double_4_suite::test_linear_increase_from_offset()",local_80,pvVar1);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push(&local_70,14.0);
  local_80[0] = local_70.member.mean;
  local_80[1] = 12.5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","12.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x10f,"void mean_double_4_suite::test_linear_increase_from_offset()",local_80,pvVar1);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push(&local_70,15.0);
  local_80[0] = local_70.member.mean;
  local_80[1] = 13.5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","13.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x111,"void mean_double_4_suite::test_linear_increase_from_offset()",local_80,pvVar1);
  return;
}

Assistant:

void test_linear_increase_from_offset()
{
    window::moment<double, 4> filter;
    filter.push(10.0);
    TRIAL_TEST_EQ(filter.mean(), 10.0);
    filter.push(11.0);
    TRIAL_TEST_EQ(filter.mean(), 10.5);
    filter.push(12.0);
    TRIAL_TEST_EQ(filter.mean(), 11.0);
    filter.push(13.0);
    TRIAL_TEST_EQ(filter.mean(), 11.5);
    filter.push(14.0);
    TRIAL_TEST_EQ(filter.mean(), 12.5);
    filter.push(15.0);
    TRIAL_TEST_EQ(filter.mean(), 13.5);
}